

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.hpp
# Opt level: O1

void boost::algorithm::trim_left_if<std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input,
               is_any_ofF<char> *IsSpace)

{
  char *pcVar1;
  pointer pcVar2;
  bool bVar3;
  anon_union_16_2_ba345be5_for_m_Storage *__dest;
  ulong uVar4;
  size_type sVar5;
  char *pcVar6;
  anon_union_16_2_ba345be5_for_m_Storage local_40;
  ulong local_30;
  
  pcVar1 = (Input->_M_dataplus)._M_p;
  sVar5 = Input->_M_string_length;
  uVar4 = IsSpace->m_Size;
  local_40.m_dynSet = (set_value_type *)0x0;
  local_30 = uVar4;
  if (uVar4 < 0x11) {
    __dest = &local_40;
  }
  else {
    __dest = (anon_union_16_2_ba345be5_for_m_Storage *)operator_new__(uVar4);
    IsSpace = (is_any_ofF<char> *)(IsSpace->m_Storage).m_dynSet;
    local_40.m_dynSet = (set_value_type *)__dest;
  }
  memcpy(__dest,IsSpace,uVar4);
  pcVar6 = pcVar1;
  if (sVar5 != 0) {
    do {
      bVar3 = detail::is_any_ofF<char>::operator()((is_any_ofF<char> *)&local_40,*pcVar6);
      if (!bVar3) break;
      pcVar6 = pcVar6 + 1;
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
  }
  pcVar2 = (Input->_M_dataplus)._M_p;
  uVar4 = (long)pcVar1 - (long)pcVar2;
  if (pcVar2 + Input->_M_string_length == pcVar6) {
    Input->_M_string_length = uVar4;
    pcVar2[uVar4] = '\0';
  }
  else {
    std::__cxx11::string::_M_erase((ulong)Input,uVar4);
  }
  if ((0x10 < local_30) &&
     ((anon_union_16_2_ba345be5_for_m_Storage *)local_40.m_dynSet !=
      (anon_union_16_2_ba345be5_for_m_Storage *)0x0)) {
    operator_delete__(local_40.m_dynSet);
  }
  return;
}

Assistant:

inline void trim_left_if(SequenceT& Input, PredicateT IsSpace)
        {
            Input.erase( 
                ::boost::begin(Input),
                ::boost::algorithm::detail::trim_begin( 
                    ::boost::begin(Input), 
                    ::boost::end(Input), 
                    IsSpace));
        }